

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_pstream.c
# Opt level: O3

void HTS_PStream_calc_wuw_and_wum(HTS_PStream *pst,size_t m)

{
  ulong uVar1;
  double dVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  double *pdVar6;
  size_t sVar7;
  int *piVar8;
  int *piVar9;
  double *pdVar10;
  double *pdVar11;
  ulong uVar12;
  long lVar13;
  size_t sVar14;
  long lVar15;
  long lVar16;
  ulong uVar17;
  double dVar18;
  
  uVar4 = pst->length;
  if (uVar4 != 0) {
    uVar5 = pst->width;
    pdVar6 = (pst->sm).wum;
    sVar7 = pst->win_size;
    uVar17 = 0;
    do {
      pdVar6[uVar17] = 0.0;
      if (uVar5 != 0) {
        memset((pst->sm).wuw[uVar17],0,uVar5 * 8);
      }
      if (sVar7 != 0) {
        piVar8 = pst->win_l_width;
        piVar9 = pst->win_r_width;
        sVar14 = 0;
        do {
          lVar15 = (long)piVar8[sVar14];
          iVar3 = piVar9[sVar14];
          if (piVar8[sVar14] <= iVar3) {
            lVar16 = lVar15 * -8;
            do {
              uVar12 = lVar15 + (int)uVar17;
              if (uVar12 < uVar4 && -1 < (long)uVar12) {
                pdVar10 = pst->win_coefficient[sVar14];
                dVar18 = pdVar10[-lVar15];
                if ((dVar18 != 0.0) || (NAN(dVar18))) {
                  lVar13 = pst->vector_length * sVar14 + m;
                  dVar18 = dVar18 * (pst->sm).ivar[uVar17 + lVar15][lVar13];
                  pdVar6[uVar17] = (pst->sm).mean[uVar17 + lVar15][lVar13] * dVar18 + pdVar6[uVar17]
                  ;
                  if (uVar5 != 0) {
                    uVar12 = 1;
                    lVar13 = 0;
                    do {
                      if (lVar13 >> 0x20 <= iVar3 + lVar15) {
                        dVar2 = *(double *)((long)pdVar10 + uVar12 * 8 + lVar16 + -8);
                        if ((dVar2 != 0.0) || (NAN(dVar2))) {
                          pdVar11 = (pst->sm).wuw[uVar17];
                          pdVar11[uVar12 - 1] = dVar2 * dVar18 + pdVar11[uVar12 - 1];
                        }
                      }
                      if (uVar5 <= uVar12) break;
                      uVar1 = uVar17 + uVar12;
                      lVar13 = lVar13 + 0x100000000;
                      uVar12 = uVar12 + 1;
                    } while (uVar1 < uVar4);
                  }
                }
              }
              lVar15 = lVar15 + 1;
              lVar16 = lVar16 + -8;
            } while (iVar3 + 1 != (int)lVar15);
          }
          sVar14 = sVar14 + 1;
        } while (sVar14 != sVar7);
      }
      uVar17 = uVar17 + 1;
    } while (uVar17 != uVar4);
  }
  return;
}

Assistant:

static void HTS_PStream_calc_wuw_and_wum(HTS_PStream * pst, size_t m)
{
   size_t t, i, j;
   int shift;
   double wu;

   for (t = 0; t < pst->length; t++) {
      /* initialize */
      pst->sm.wum[t] = 0.0;
      for (i = 0; i < pst->width; i++)
         pst->sm.wuw[t][i] = 0.0;

      /* calc WUW & WUM */
      for (i = 0; i < pst->win_size; i++)
         for (shift = pst->win_l_width[i]; shift <= pst->win_r_width[i]; shift++)
            if (((int) t + shift >= 0) && ((int) t + shift < pst->length) && (pst->win_coefficient[i][-shift] != 0.0)) {
               wu = pst->win_coefficient[i][-shift] * pst->sm.ivar[t + shift][i * pst->vector_length + m];
               pst->sm.wum[t] += wu * pst->sm.mean[t + shift][i * pst->vector_length + m];
               for (j = 0; (j < pst->width) && (t + j < pst->length); j++)
                  if (((int) j <= pst->win_r_width[i] + shift) && (pst->win_coefficient[i][j - shift] != 0.0))
                     pst->sm.wuw[t][j] += wu * pst->win_coefficient[i][j - shift];
            }
   }
}